

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::gc_pass_init(CVmObjTable *this)

{
  CVmObjTable *in_RDI;
  CVmObjTable *unaff_retaddr;
  
  in_RDI->allocs_since_gc_ = 0;
  in_RDI->bytes_since_gc_ = 0;
  gc_trace_stack(unaff_retaddr);
  gc_trace_imports(in_RDI);
  gc_trace_globals(this);
  CVmUndo::gc_mark_refs((CVmUndo *)unaff_retaddr);
  return;
}

Assistant:

void CVmObjTable::gc_pass_init(VMG0_)
{
    /* 
     *   reset the allocations-since-gc counter, since this is now the
     *   last gc pass, and we obviously haven't performed any allocations
     *   since this gc pass yet 
     */
    allocs_since_gc_ = 0;
    bytes_since_gc_ = 0;

    /* trace objects reachable from the stack */
    gc_trace_stack(vmg0_);

    /* trace objects reachable from imports */
    gc_trace_imports(vmg0_);

    /* trace objects reachable from machine globals */
    gc_trace_globals(vmg0_);

    /*
     *   Process undo records - for each undo record, mark any referenced
     *   objects as reachable.  Undo records are part of the root set.  
     */
    G_undo->gc_mark_refs(vmg0_);
}